

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

Byte ppmd_read(void *p)

{
  Byte *pBVar1;
  uint8_t *data;
  ssize_t bytes_avail;
  zip *zip;
  archive_read *a;
  void *p_local;
  
  zip = *p;
  bytes_avail = **(ssize_t **)((zip->ppmd8).See[3] + 0x14);
  data = (uint8_t *)0x0;
  a = (archive_read *)p;
  pBVar1 = (Byte *)__archive_read_ahead((archive_read *)zip,1,(ssize_t *)&data);
  if ((long)data < 1) {
    *(undefined1 *)(bytes_avail + 0x1ec9) = 1;
    p_local._7_1_ = '\0';
  }
  else {
    __archive_read_consume((archive_read *)zip,1);
    *(long *)(bytes_avail + 0x1e0) = *(long *)(bytes_avail + 0x1e0) + 1;
    p_local._7_1_ = *pBVar1;
  }
  return p_local._7_1_;
}

Assistant:

static Byte
ppmd_read(void *p)
{
  struct archive_read *a = ((IByteIn*)p)->a;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  Byte b;
  if (!rar_br_read_ahead(a, br, 8))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return 0;
  }
  b = rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return b;
}